

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_MissingFileName_Test::TestBody
          (ValidationErrorTest_MissingFileName_Test *this)

{
  string local_48;
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,anon_var_dwarf_a12c75 + 5);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher((Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&local_28,": : OTHER: Missing field: FileDescriptorProto.name.\n");
  ValidationErrorTest::BuildFileWithErrors
            (&this->super_ValidationErrorTest,&local_48,
             (Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_28);
  testing::internal::
  MatcherBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~MatcherBase(&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST_F(ValidationErrorTest, MissingFileName) {
  BuildFileWithErrors("",

                      ": : OTHER: Missing field: FileDescriptorProto.name.\n");
}